

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O1

ssize_t __thiscall BOCC_CTA::write(BOCC_CTA *this,int __fd,void *__buf,size_t __n)

{
  DataItem *pDVar1;
  int iVar2;
  mapped_type *ppTVar3;
  void *__buf_00;
  int __fd_00;
  key_type local_34;
  
  __buf_00 = (void *)(__n & 0xffffffff);
  std::__shared_mutex_pthread::lock_shared(&(this->scheduler_lock)._M_impl);
  ppTVar3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->transactions,&local_34);
  __fd_00 = (int)__buf;
  Transaction::write(*ppTVar3,__fd_00,__buf_00,__n);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                             &(this->dataItems).
                              super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
                              super__Vector_impl_data._M_start[__fd_00]->lock);
  if (iVar2 == 0) {
    pDVar1 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
             super__Vector_impl_data._M_start[__fd_00];
    ppTVar3 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->transactions,&local_34);
    std::
    _Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
    ::_M_insert_unique<Transaction*const&>
              ((_Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
                *)&pDVar1->read_list,ppTVar3);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                _M_impl.super__Vector_impl_data._M_start[__fd_00]->lock);
    pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
    return 0;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

int BOCC_CTA::write(int tid, int dIdx, const int value) {
    scheduler_lock.lock_shared();
    transactions[tid]->write(dIdx, value);
    dataItems[dIdx]->lock.lock();

    dataItems[dIdx]->read_list.insert(transactions[tid]);

    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();
    return 0;
}